

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char>_>
fmt::v8::detail::write<char,std::back_insert_iterator<fmt::v8::detail::buffer<char>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char>_> out,char *value)

{
  char *pcVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar2;
  basic_string_view<char> value_00;
  char *value_local;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> out_local;
  
  if (value == (char *)0x0) {
    throw_format_error("string pointer is null");
  }
  pcVar1 = (char *)std::char_traits<char>::length(value);
  value_00.size_ = (size_t)pcVar1;
  value_00.data_ = pcVar1;
  bVar2 = write<char,std::back_insert_iterator<fmt::v8::detail::buffer<char>>>
                    (out.container,(back_insert_iterator<fmt::v8::detail::buffer<char>_>)value,
                     value_00);
  return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR_CHAR_TRAITS auto write(OutputIt out, const Char* value)
    -> OutputIt {
  if (!value) {
    throw_format_error("string pointer is null");
  } else {
    out = write(out, basic_string_view<Char>(value));
  }
  return out;
}